

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O2

void compute_vels(float (*Ix) [512],float (*Iy) [512],float (*It) [512],float (*full_vels) [512] [2]
                 ,float (*norm_vels1) [512] [2],float (*norm_vels2) [512] [2],int pic_x,int pic_y,
                 int n,float tau_D,int flag,float (*E) [512])

{
  float fVar1;
  undefined1 auVar2 [16];
  float afVar3 [2];
  int iVar4;
  float (*pafVar5) [5];
  long lVar6;
  long lVar7;
  long lVar8;
  float (*paafVar9) [512] [2];
  long lVar10;
  float (*paafVar11) [512] [2];
  float (*paafVar12) [512] [2];
  long lVar13;
  float (*pafVar14) [512];
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  uint uVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  float eigenvalues [2];
  ulong local_1b0;
  int nrot;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float (*local_170) [512] [2];
  float (*local_168) [512];
  float (*local_160) [512];
  float (*local_158) [512] [2];
  float (*local_150) [512];
  float (*local_148) [512];
  long local_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  float angle;
  float length2;
  float length1;
  float local_c8 [8];
  float diff2 [2];
  float diff1 [2];
  float weight [5] [5];
  
  local_168 = E;
  local_188 = (float)n;
  local_118._0_4_ = pic_y;
  local_138 = (float)pic_x;
  local_170 = norm_vels1;
  local_160 = It;
  local_158 = norm_vels2;
  local_150 = Ix;
  local_148 = Iy;
  printf("Eigenvalue Threshold: %f\n",SUB84((double)tau_D,0));
  printf("Threshold on Raw Normal Velocities: %f\n",SUB84((double)RAW_MAG,0));
  MAX_RAW_MAG = -INFINITY;
  fflush(_stdout);
  local_c8[4] = 0.0625;
  local_c8[0] = 0.0625;
  local_c8[1] = 0.25;
  local_c8[2] = 0.375;
  local_c8[3] = 0.25;
  puts("Coefficients");
  fVar20 = 0.0;
  pafVar5 = weight;
  for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
    fVar26 = local_c8[lVar16];
    for (lVar17 = 0; lVar17 != 5; lVar17 = lVar17 + 1) {
      fVar19 = local_c8[lVar17] * fVar26;
      (*pafVar5)[lVar17] = fVar19;
      printf("%12.8f \n",SUB84((double)fVar19,0));
      fVar20 = fVar20 + fVar19;
    }
    putchar(10);
    pafVar5 = pafVar5 + 1;
  }
  printf("Sum=%f\n",SUB84((double)fVar20,0));
  lVar16 = 0;
  paafVar9 = full_vels;
  paafVar11 = local_170;
  paafVar12 = local_158;
  pafVar14 = local_168;
  for (lVar17 = 0; lVar17 != 0x200; lVar17 = lVar17 + 1) {
    for (lVar15 = 0; lVar15 != 0x800; lVar15 = lVar15 + 4) {
      *(undefined8 *)((long)(*paafVar9)[0] + lVar15 * 2) = 0x42c8000042c80000;
      *(undefined8 *)((long)(*paafVar11)[0] + lVar15 * 2) = 0x42c8000042c80000;
      *(undefined8 *)((long)(*paafVar12)[0] + lVar15 * 2) = 0x42c8000042c80000;
      *(undefined4 *)((long)*pafVar14 + lVar15) = 0;
      *(undefined4 *)((long)Imag[0] + lVar16 + lVar15) = 0;
    }
    pafVar14 = pafVar14 + 1;
    paafVar12 = paafVar12 + 1;
    paafVar11 = paafVar11 + 1;
    paafVar9 = paafVar9 + 1;
    lVar16 = lVar16 + 0x800;
  }
  lVar15 = (long)(int)local_188;
  local_e0 = (long)(local_118._0_4_ - (int)local_188);
  local_100 = (long)((int)local_138 - (int)local_188);
  lVar17 = lVar15 * 0x804;
  lVar18 = (long)local_150 + lVar17 + -0x1008;
  lVar16 = (long)local_148 + lVar17 + -0x1008;
  lVar17 = (long)local_160 + lVar17 + -0x1008;
  local_1b0 = 0;
  local_1cc = 0;
  local_1c0 = 0;
  local_1c8 = 0;
  local_1c4 = 0;
  local_1bc = 0;
  local_108 = lVar15;
  while (lVar8 = local_108, lVar6 = lVar17, lVar7 = lVar16, lVar10 = lVar18, lVar15 < local_100) {
    for (; local_e8 = lVar10, local_f0 = lVar7, local_f8 = lVar6, local_140 = lVar15,
        lVar8 < local_e0; lVar8 = lVar8 + 1) {
      local_188 = 0.0;
      fStack_184 = 0.0;
      fStack_180 = 0.0;
      fStack_17c = 0.0;
      local_194 = 0.0;
      pafVar5 = weight;
      fVar20 = 1.0;
      local_138 = 0.0;
      fStack_134 = 0.0;
      fStack_130 = 0.0;
      fStack_12c = 0.0;
      lVar6 = lVar17;
      lVar7 = lVar16;
      lVar10 = lVar18;
      for (lVar15 = -2; lVar15 != 3; lVar15 = lVar15 + 1) {
        for (lVar13 = 0; lVar13 != 5; lVar13 = lVar13 + 1) {
          if (flag == 1) {
            fVar20 = *(float *)(lVar10 + lVar13 * 4);
            fVar26 = *(float *)(lVar7 + lVar13 * 4);
            fVar20 = (fVar20 * fVar20 + fVar26 * fVar26) * 0.08 + 1.0;
          }
          fVar26 = (*pafVar5)[lVar13];
          fVar19 = *(float *)(lVar10 + lVar13 * 4);
          fVar22 = *(float *)(lVar7 + lVar13 * 4);
          auVar24._0_4_ = fVar22 * fVar22 * fVar26;
          auVar24._4_4_ = fVar19 * fVar19 * fVar26;
          auVar24._8_4_ = fVar26 * 0.0;
          auVar24._12_4_ = fVar26 * 0.0;
          auVar25._4_4_ = fVar20;
          auVar25._0_4_ = fVar20;
          auVar25._8_4_ = fVar20;
          auVar25._12_4_ = fVar20;
          auVar25 = divps(auVar24,auVar25);
          local_188 = local_188 + auVar25._0_4_;
          fStack_184 = fStack_184 + auVar25._4_4_;
          fStack_180 = fStack_180 + auVar25._8_4_;
          fStack_17c = fStack_17c + auVar25._12_4_;
          local_194 = local_194 + (fVar19 * fVar22 * fVar26) / fVar20;
          fVar1 = *(float *)(lVar6 + lVar13 * 4);
          auVar23._0_4_ = fVar1 * fVar19 * fVar26;
          auVar23._4_4_ = fVar1 * fVar22 * fVar26;
          auVar23._8_4_ = fVar1 * 0.0 * fVar26;
          auVar23._12_4_ = fVar1 * 0.0 * fVar26;
          auVar2._4_4_ = fVar20;
          auVar2._0_4_ = fVar20;
          auVar2._8_4_ = fVar20;
          auVar2._12_4_ = fVar20;
          auVar25 = divps(auVar23,auVar2);
          local_138 = local_138 + auVar25._0_4_;
          fStack_134 = fStack_134 + auVar25._4_4_;
          fStack_130 = fStack_130 + auVar25._8_4_;
          fStack_12c = fStack_12c + auVar25._12_4_;
        }
        lVar10 = lVar10 + 0x800;
        lVar7 = lVar7 + 0x800;
        lVar6 = lVar6 + 0x800;
        pafVar5 = pafVar5 + 1;
      }
      local_118 = ZEXT416((uint)local_194);
      if (flag == 1) {
        local_188 = local_188 + 0.5;
        fStack_184 = fStack_184 + 0.5;
        fStack_180 = fStack_180 + 0.0;
        fStack_17c = fStack_17c + 0.0;
      }
      local_198 = fStack_184;
      local_190 = local_194;
      local_18c = local_188;
      jacobi((float (*) [2])&local_198,2,eigenvalues,(float (*) [2])&local_128,&nrot);
      iVar4 = check_eigen_calc((float (*) [2])&local_198,eigenvalues,(float (*) [2])&local_128,nrot,
                               diff1,diff2,&length1,&length2,&angle);
      fVar19 = fStack_120;
      fVar26 = local_128;
      fVar20 = eigenvalues[0];
      if (iVar4 == 0) {
        local_1c4 = local_1c4 + 1;
      }
      else {
        if (eigenvalues[0] < eigenvalues[1]) {
          eigenvalues[0] = eigenvalues[1];
          eigenvalues[1] = fVar20;
          local_128 = fStack_124;
          fStack_124 = fVar26;
          fStack_120 = fStack_11c;
          fStack_11c = fVar19;
        }
        fVar26 = fStack_184 * local_188 - (float)local_118._0_4_ * (float)local_118._0_4_;
        fVar20 = -(float)local_118._0_4_ / fVar26;
        if ((eigenvalues[0] < tau_D) || (eigenvalues[1] < tau_D)) {
          if ((eigenvalues[0] <= tau_D) || (ABS(fVar26) <= 1e-08)) {
            local_1c8 = local_1c8 + 1;
          }
          else {
            fVar20 = (float)((uint)((local_188 / fVar26) * local_138 + fStack_134 * fVar20) ^
                            (uint)DAT_00105080) * local_128 -
                     (fVar20 * local_138 + (fStack_184 / fVar26) * fStack_134) * fStack_120;
            afVar3[1] = (float)((uint)fVar20 ^ (uint)DAT_00105080) * local_128;
            afVar3[0] = fVar20 * fStack_120;
            local_170[local_140][lVar8] = afVar3;
            local_1cc = local_1cc + 1;
          }
        }
        else if (fVar26 <= 0.0) {
          full_vels[local_140][lVar8] = (float  [2])0x42c8000042c80000;
        }
        else {
          fVar19 = (local_188 / fVar26) * local_138 + fStack_134 * fVar20;
          full_vels[local_140][lVar8][1] = fVar19;
          uVar21 = (uint)DAT_00105080;
          fVar26 = (float)((uint)(fVar20 * local_138 + (fStack_184 / fVar26) * fStack_134) ^ uVar21)
          ;
          full_vels[local_140][lVar8][0] = fVar26;
          fVar20 = local_168[local_140][lVar8];
          pafVar5 = weight;
          lVar6 = lVar17;
          lVar7 = lVar16;
          lVar10 = lVar18;
          for (lVar15 = -2; lVar15 != 3; lVar15 = lVar15 + 1) {
            for (lVar13 = 0; lVar13 != 5; lVar13 = lVar13 + 1) {
              fVar22 = (*(float *)(lVar10 + lVar13 * 4) * (float)((uint)fVar19 ^ uVar21) +
                        *(float *)(lVar7 + lVar13 * 4) * fVar26 + *(float *)(lVar6 + lVar13 * 4)) *
                       (*pafVar5)[lVar13];
              fVar20 = fVar20 + fVar22 * fVar22;
              local_168[local_140][lVar8] = fVar20;
            }
            pafVar5 = pafVar5 + 1;
            lVar10 = lVar10 + 0x800;
            lVar7 = lVar7 + 0x800;
            lVar6 = lVar6 + 0x800;
          }
          local_1b0 = (ulong)((int)local_1b0 + 1);
        }
      }
      fVar20 = local_150[local_140][lVar8] * local_150[local_140][lVar8] +
               local_148[local_140][lVar8] * local_148[local_140][lVar8];
      fVar26 = SQRT(fVar20);
      Imag[local_140][lVar8] = fVar26;
      if (MAX_RAW_MAG < fVar26) {
        MAX_RAW_MAG = fVar26;
      }
      if (fVar26 <= RAW_MAG) {
        local_1bc = local_1bc + 1;
      }
      else {
        local_158[local_140][lVar8][1] =
             (local_160[local_140][lVar8] * local_150[local_140][lVar8]) / fVar20;
        local_158[local_140][lVar8][0] =
             (-local_160[local_140][lVar8] * local_148[local_140][lVar8]) / fVar20;
        local_1c0 = local_1c0 + 1;
      }
      lVar18 = lVar18 + 4;
      lVar16 = lVar16 + 4;
      lVar17 = lVar17 + 4;
      lVar15 = local_140;
      lVar6 = local_f8;
      lVar7 = local_f0;
      lVar10 = local_e8;
    }
    lVar18 = local_e8 + 0x800;
    lVar16 = local_f0 + 0x800;
    lVar17 = local_f8 + 0x800;
    lVar15 = local_140 + 1;
  }
  printf("%d full velocities computed\n",local_1b0);
  printf("%d least squares normal velocities computed\n",(ulong)local_1cc);
  printf("%d raw normal velocities computed\n",(ulong)local_1c0);
  printf("%d locations where velocity information thresholded\n",(ulong)local_1c8);
  printf("%d locations where eigenvalue/eigenvector calculation failed\n",(ulong)local_1c4);
  printf("%d locations with spatial gradient is zero\n",(ulong)local_1bc);
  fflush(_stdout);
  return;
}

Assistant:

void compute_vels(
float Ix[PIC_X][PIC_Y],
float Iy[PIC_X][PIC_Y],
float It[PIC_X][PIC_Y],
float full_vels[PIC_X][PIC_Y][2],
float norm_vels1[PIC_X][PIC_Y][2],
float norm_vels2[PIC_X][PIC_Y][2],
int pic_x, int pic_y, int n,
float tau_D,
int flag, float E[PIC_X][PIC_Y])
{
float mag,M[2][2],MI[2][2],B[2],denominator;
float eigenvalues[2],eigenvectors[2][2],length1,length2;
float angle,temp1,v1,v2;
float sigma1,sigma2,sigmap,temp,diff1[N],diff2[N];
int i,j,k,l,full_count,norm_count1,norm_count2,no_count,nrot,eigen_count,no_swaps;
float eigenvalues2[2],eigenvectors2[2][2],weight[5][5],sum,coeff[5],v[2];
int mag_zero;
int kk;


printf("Eigenvalue Threshold: %f\n",tau_D);
printf("Threshold on Raw Normal Velocities: %f\n",RAW_MAG);
MAX_RAW_MAG = (float) -HUGE_VAL;
mag_zero = 0;
fflush(stdout);
/* Parameter values as specified in Simoncelli, Adelson and Heeger, page 313  */
sigma1 = 0.08f;
sigma2 = 1.0f;
sigmap = 2.0f;

/* Compute weights */
sum = 0.0;
coeff[0] = coeff[4] = 0.0625;
coeff[1] = coeff[3] = 0.25;
coeff[2] = 0.375;
printf("Coefficients\n");
for(i=0;i<5;i++)
{
for(j=0;j<5;j++)
	{
	weight[i][j] = coeff[i]*coeff[j];
	printf("%12.8f \n",weight[i][j]);
	sum += weight[i][j];
	}
printf("\n");
}
printf("Sum=%f\n",sum);
full_count = 0;
norm_count1 = norm_count2 = 0;
no_count = 0;
eigen_count = 0;
no_swaps = 0;
for(i=0;i<PIC_X;i++)
for(j=0;j<PIC_Y;j++)
	{
	full_vels[i][j][0] = full_vels[i][j][1] = NO_VALUE;
	norm_vels1[i][j][0] = norm_vels1[i][j][1] = NO_VALUE;
	norm_vels2[i][j][0] = norm_vels2[i][j][1] = NO_VALUE;
	if(DEBUG) for(kk=0;kk<8;kk++) data[kk][i][j] = 0.0;
	Imag[i][j] = E[i][j] = 0.0;
	}

for(i=n;i<pic_x-n;i++)
for(j=n;j<pic_y-n;j++)
	{
	M[0][0] = M[1][1] = M[0][1] = M[1][0] = 0.0;
	B[0] = B[1] = 0.0;
	mag = 1.0;
	/* Compute on 5*5 neighbourhood */
	for(k=(-2);k<=2;k++)
	for(l=(-2);l<=2;l++)
		{
		if(flag==TRUE) mag = sigma1*(Ix[i+k][j+l]*Ix[i+k][j+l]+
		                             Iy[i+k][j+l]*Iy[i+k][j+l])+sigma2;
		M[0][0] = M[0][0] + weight[k+2][l+2]*(Ix[i+k][j+l]*Ix[i+k][j+l])/mag;
		M[1][1] = M[1][1] + weight[k+2][l+2]*(Iy[i+k][j+l]*Iy[i+k][j+l])/mag;
		M[0][1] = M[0][1] + weight[k+2][l+2]*(Ix[i+k][j+l]*Iy[i+k][j+l])/mag;
		B[0] = B[0] + weight[k+2][l+2]*(Ix[i+k][j+l]*It[i+k][j+l])/mag;
		B[1] = B[1] + weight[k+2][l+2]*(Iy[i+k][j+l]*It[i+k][j+l])/mag;
		}
	if(DEBUG)
	{
	data[0][i][j] = M[0][0];
	data[1][i][j] = M[0][1];
	data[2][i][j] = M[1][1];
	data[3][i][j] = B[0];
	data[4][i][j] = B[1];
	data[5][i][j] = Ix[i][j];
	data[6][i][j] = Iy[i][j];
	data[7][i][j] = It[i][j];
	}
	M[1][0] = M[0][1]; /* The M array is symmetric */
	if(flag==TRUE)
		{
		M[0][0] = M[0][0] + 1.0f/sigmap;
		M[1][1] = M[1][1] + 1.0f/sigmap;
		}
	/* Invert 2*2 matrix */
	denominator = M[0][0]*M[1][1]-M[1][0]*M[0][1]; /* The determinant of M */
	MI[0][0] = M[1][1]/denominator;
	MI[0][1] = -M[0][1]/denominator;
	MI[1][0] = -M[1][0]/denominator;
	MI[1][1] = M[0][0]/denominator;

	jacobi(M,2,eigenvalues,eigenvectors,&nrot);
	if(check_eigen_calc(M,eigenvalues,eigenvectors,nrot,diff1,diff2,
		&length1,&length2,&angle)==FALSE)
		{
		if(FALSE)
		{
		printf("\n********************************************\n");
		printf("Fatal error: eigenvalue/eigenvector error\n");
		printf("i=%d j=%d\n",i,j);
		printf("eigenvalues: %f %f\n",eigenvalues[0],eigenvalues[1]);
		printf("eigenvector1: %f %f\n",eigenvectors[0][0],eigenvectors[1][0]);
		printf("eigenvector2: %f %f\n",eigenvectors[0][1],eigenvectors[1][1]);
		printf("\n      M:                        MI\n");
		printf("%12.6f %12.6f %12.6f %12.6f\n",M[0][0],M[0][1],MI[0][0],MI[0][1]);
		printf("%12.6f %12.6f %12.6f %12.6f\n",M[1][0],M[1][1],MI[1][0],MI[1][1]);
		printf("B: %f %f\n",B[0],B[1]);
		printf("Determinant of M: %f\n",denominator);
		printf("nrot: %d\n",nrot);
		printf("Angle between two eigenvectors: %f degrees\n",angle);
		printf("Difference length for eigenvector1\n");
		printf("Difference: %f %f Length: %f\n",diff1[0],diff1[1],length1);
		printf("Difference length for eigenvector2\n");
		printf("Difference: %f %f Length: %f\n",diff2[0],diff2[1],length2);
		/* Check eigenvalues/eigenvectors for 2*2 matrix using
		   closed form method as in Anandan's thesis */
		eigenvalues2[0] = 0.5*((M[0][0]+M[1][1]) -
		  sqrt((M[0][0]-M[1][1])*(M[0][0]-M[1][1])+4.0*M[0][1]*M[1][0]));
		eigenvalues2[1] = 0.5*((M[0][0]+M[1][1]) +
		  sqrt((M[0][0]-M[1][1])*(M[0][0]-M[1][1])+4.0*M[0][1]*M[1][0]));
		angle = (float) atan2(eigenvalues2[0]-M[0][0],M[0][1]);
		eigenvectors2[0][0] = (float) -cos(angle);
		eigenvectors2[1][0] = (float) -sin(angle);
		eigenvectors2[0][1] = (float) -sin(angle);
		eigenvectors2[1][1] = (float) cos(angle);
		printf("\nUsing Anandan's calculation:\n");
		printf("Angle of rotation: %f degrees\n",angle*180/HALF_C);
		printf("eigenvalues: %f %f\n",eigenvalues2[0],eigenvalues2[1]);
		printf("eigenvector1: %f %f\n",eigenvectors2[0][0],eigenvectors2[1][0]);
		printf("eigenvector2: %f %f\n",eigenvectors2[0][1],eigenvectors2[1][1]);
		check_eigen_calc(M,eigenvalues2,eigenvectors2,nrot,diff1,diff2,
				 &length1,&length2,&angle);
		printf("Angle between two eigenvectors: %f degrees\n",angle);
		printf("Difference length for eigenvector1\n");
		printf("Difference: %f %f Length: %f\n",diff1[0],diff1[1],length1);
		printf("Difference length for eigenvector2\n");
		printf("Difference: %f %f Length: %f\n",diff2[0],diff2[1],length2);
		printf("********************************************\n\n");
		fflush(stdout);
		if(FALSE) exit(1);
		}
		eigen_count++;
		}
	else
	{
	/* Sort the eigenvalues and the corresponding eigenvectors */
	/* Most likely, already ordered				   */
	if(eigenvalues[0] < eigenvalues[1]) /* Largest eigenvalue first */
		{
		/* swap eigenvalues */
		temp = eigenvalues[0];
		eigenvalues[0] = eigenvalues[1];
		eigenvalues[1] = temp;
		/* swap eigenvector components */
		temp = eigenvectors[0][0];
		eigenvectors[0][0] = eigenvectors[0][1];
		eigenvectors[0][1] = temp;
		temp = eigenvectors[1][0];
		eigenvectors[1][0] = eigenvectors[1][1];
		eigenvectors[1][1] = temp;
		no_swaps++;
		}

	/* Full velocity if spread of M is small */
	if(eigenvalues[0] >= tau_D && eigenvalues[1] >= tau_D)
	{
	if(denominator > 0.0)
		{
		full_vels[i][j][1] = -(v1= -(MI[0][0]*B[0]+MI[0][1]*B[1]));
		full_vels[i][j][0] =  (v2= -(MI[1][0]*B[0]+MI[1][1]*B[1]));
		/* Compute the residual */
		for(k=(-2);k<=2;k++)
		for(l=(-2);l<=2;l++)
			{
			temp1 = weight[k+2][l+2]*
			      (Ix[i+k][j+l]*v1+
			       Iy[i+k][j+l]*v2+It[i+k][j+l]);
			/* temp2 = weight[k+2][l+2]*It[i+k][j+l]; */
			E[i][j] += (temp1*temp1);
			}
		full_count++;
		}
	else { full_vels[i][j][0] = full_vels[i][j][1] = NO_VALUE; }
	}
	/* Normal velocity if spread of M is small in one direction only */
	else if(eigenvalues[0] > tau_D && fabs(denominator) > 0.00000001)
	/* Normal velocity if spread of MI is small in one direction only */
		{
		/* Project v onto that direction */
		v[0] = -(MI[0][0]*B[0]+MI[0][1]*B[1]);
		v[1] = -(MI[1][0]*B[0]+MI[1][1]*B[1]);
		norm_vels1[i][j][1] = -(v[0]*eigenvectors[0][0]+
				      v[1]*eigenvectors[1][0])*eigenvectors[0][0];
		norm_vels1[i][j][0] = (v[0]*eigenvectors[0][0]+
				      v[1]*eigenvectors[1][0])*eigenvectors[1][0];
		norm_count1++;
		/* if(i >= 50 && i <= 60 && j >= 50 && j <= 60)
		printf("Normal velocity at i:%d j:%d: %f %f\n",i,j,norm_vels1[i][j][0],norm_vels1[i][j][1]); */
		}
	else
		{
		/* printf("No velocity\n"); */
		no_count++;
		}
	}

	/* Compute type 2 normal velocity */
	mag = (Ix[i][j]*Ix[i][j] + Iy[i][j]*Iy[i][j]);
	Imag[i][j] = (float) sqrt(mag);
	if(Imag[i][j] > MAX_RAW_MAG) MAX_RAW_MAG = Imag[i][j];
	if(Imag[i][j] > RAW_MAG)
	{
	norm_vels2[i][j][1] =  It[i][j]*Ix[i][j]/mag;
	norm_vels2[i][j][0] = -It[i][j]*Iy[i][j]/mag;
	norm_count2++;
	}
	else mag_zero++;
	}

printf("%d full velocities computed\n",full_count);
printf("%d least squares normal velocities computed\n",norm_count1);
printf("%d raw normal velocities computed\n",norm_count2);
printf("%d locations where velocity information thresholded\n",no_count);
printf("%d locations where eigenvalue/eigenvector calculation failed\n",eigen_count);
printf("%d locations with spatial gradient is zero\n",mag_zero);
fflush(stdout);
if(DEBUG) for(kk=0;kk<8;kk++) fwrite(&data[kk][0][0], sizeof(float), 150*150, fd_temp[kk]);
}